

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O1

void test_base_swaps<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,true>>>
               (void)

{
  template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<true,_(Column_types)7,_true,_true,_false,_true,_true>_>_>_>
  *this;
  uint uVar1;
  uint uVar2;
  pointer puVar3;
  pointer puVar4;
  pointer puVar5;
  pointer puVar6;
  Column_settings *pCVar7;
  Column_settings *pCVar8;
  ulong uVar9;
  undefined8 uVar10;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  columns;
  Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true>_>
  m;
  uint local_19c [3];
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_190;
  Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true>_>
  local_178;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,true>>>>
            ();
  local_178.colSettings_ = (Column_settings *)operator_new(0x38);
  (((Entry_constructor *)
   &((pool<boost::default_user_allocator_malloc_free> *)local_178.colSettings_)->
    super_simple_segregated_storage<unsigned_long>)->entryPool_).
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  (((pool<boost::default_user_allocator_malloc_free> *)local_178.colSettings_)->list).ptr =
       (char *)0x0;
  (((pool<boost::default_user_allocator_malloc_free> *)local_178.colSettings_)->list).sz = 0;
  ((pool<boost::default_user_allocator_malloc_free> *)local_178.colSettings_)->requested_size = 0x30
  ;
  ((pool<boost::default_user_allocator_malloc_free> *)local_178.colSettings_)->next_size = 0x20;
  ((pool<boost::default_user_allocator_malloc_free> *)local_178.colSettings_)->start_size = 0x20;
  ((pool<boost::default_user_allocator_malloc_free> *)local_178.colSettings_)->max_size = 0;
  Gudhi::persistence_matrix::
  Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,true>>>
  ::Boundary_matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,true>>>
              *)&local_178.matrix_,&local_190,local_178.colSettings_);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,true>>>
            (&local_190,&local_178);
  uVar9 = ((long)local_178.matrix_.matrix_.
                 super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_178.matrix_.matrix_.
                 super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
  if (uVar9 < 4) {
    uVar10 = 3;
  }
  else {
    uVar10 = 5;
    if (5 < uVar9) {
      Gudhi::persistence_matrix::swap
                (local_178.matrix_.matrix_.
                 super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 3,
                 local_178.matrix_.matrix_.
                 super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 5);
      local_178.matrix_.
      super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<true,_(Column_types)7,_true,_true,_false,_true,_true>_>_>_>
      .rowSwapped_ = true;
      if (5 < (ulong)(((long)local_178.matrix_.matrix_.
                             super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_178.matrix_.matrix_.
                             super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7))
      {
        Gudhi::persistence_matrix::swap
                  (local_178.matrix_.matrix_.
                   super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 5,
                   local_178.matrix_.matrix_.
                   super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1);
        local_178.matrix_.
        super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<true,_(Column_types)7,_true,_true,_false,_true,_true>_>_>_>
        .rowSwapped_ = true;
        puVar3 = local_190.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[3].
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar4 = local_190.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[3].
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        puVar5 = local_190.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[3].
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        local_190.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[3].
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_190.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[5].
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_190.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[3].
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_190.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[5].
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_190.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[3].
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_190.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[5].
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        puVar6 = local_190.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1].
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        local_190.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[5].
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_190.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_190.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[5].
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar6;
        local_190.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[5].
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_190.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_190.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[1].
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = puVar3;
        local_190.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[1].
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar4;
        local_190.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[1].
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = puVar5;
        test_content_equality<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,true>>>
                  (&local_190,&local_178);
        this = &local_178.matrix_.
                super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<true,_(Column_types)7,_true,_true,_false,_true,_true>_>_>_>
        ;
        local_178.matrix_.
        super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<true,_(Column_types)7,_true,_true,_false,_true,_true>_>_>_>
        .rowSwapped_ = true;
        uVar9 = (long)local_178.matrix_.
                      super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<true,_(Column_types)7,_true,_true,_false,_true,_true>_>_>_>
                      .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_178.matrix_.
                      super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<true,_(Column_types)7,_true,_true,_false,_true,_true>_>_>_>
                      .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 2;
        if (uVar9 < 6) {
          do {
            local_19c[0] = (uint)uVar9;
            if (local_178.matrix_.
                super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<true,_(Column_types)7,_true,_true,_false,_true,_true>_>_>_>
                .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_finish ==
                local_178.matrix_.
                super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<true,_(Column_types)7,_true,_true,_false,_true,_true>_>_>_>
                .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        (&this->indexToRow_,
                         (iterator)
                         local_178.matrix_.
                         super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<true,_(Column_types)7,_true,_true,_false,_true,_true>_>_>_>
                         .indexToRow_.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish,local_19c);
            }
            else {
              *local_178.matrix_.
               super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<true,_(Column_types)7,_true,_true,_false,_true,_true>_>_>_>
               .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish = (uint)uVar9;
              local_178.matrix_.
              super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<true,_(Column_types)7,_true,_true,_false,_true,_true>_>_>_>
              .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_178.matrix_.
                   super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<true,_(Column_types)7,_true,_true,_false,_true,_true>_>_>_>
                   .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 != 6);
        }
        uVar1 = local_178.matrix_.
                super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<true,_(Column_types)7,_true,_true,_false,_true,_true>_>_>_>
                .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_start[5];
        uVar2 = local_178.matrix_.
                super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<true,_(Column_types)7,_true,_true,_false,_true,_true>_>_>_>
                .rowToIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_start
                [local_178.matrix_.
                 super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<true,_(Column_types)7,_true,_true,_false,_true,_true>_>_>_>
                 .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start[3]];
        local_178.matrix_.
        super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<true,_(Column_types)7,_true,_true,_false,_true,_true>_>_>_>
        .rowToIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start
        [local_178.matrix_.
         super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<true,_(Column_types)7,_true,_true,_false,_true,_true>_>_>_>
         .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start[3]] =
             local_178.matrix_.
             super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<true,_(Column_types)7,_true,_true,_false,_true,_true>_>_>_>
             .rowToIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar1];
        local_178.matrix_.
        super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<true,_(Column_types)7,_true,_true,_false,_true,_true>_>_>_>
        .rowToIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar1] = uVar2;
        uVar1 = local_178.matrix_.
                super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<true,_(Column_types)7,_true,_true,_false,_true,_true>_>_>_>
                .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_start[3];
        local_178.matrix_.
        super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<true,_(Column_types)7,_true,_true,_false,_true,_true>_>_>_>
        .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[3] =
             local_178.matrix_.
             super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<true,_(Column_types)7,_true,_true,_false,_true,_true>_>_>_>
             .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[5];
        local_178.matrix_.
        super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<true,_(Column_types)7,_true,_true,_false,_true,_true>_>_>_>
        .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[5] = uVar1;
        local_178.matrix_.
        super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<true,_(Column_types)7,_true,_true,_false,_true,_true>_>_>_>
        .rowSwapped_ = true;
        uVar9 = (long)local_178.matrix_.
                      super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<true,_(Column_types)7,_true,_true,_false,_true,_true>_>_>_>
                      .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_178.matrix_.
                      super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<true,_(Column_types)7,_true,_true,_false,_true,_true>_>_>_>
                      .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 2;
        if (uVar9 < 6) {
          do {
            local_19c[0] = (uint)uVar9;
            if (local_178.matrix_.
                super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<true,_(Column_types)7,_true,_true,_false,_true,_true>_>_>_>
                .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_finish ==
                local_178.matrix_.
                super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<true,_(Column_types)7,_true,_true,_false,_true,_true>_>_>_>
                .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        (&this->indexToRow_,
                         (iterator)
                         local_178.matrix_.
                         super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<true,_(Column_types)7,_true,_true,_false,_true,_true>_>_>_>
                         .indexToRow_.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish,local_19c);
            }
            else {
              *local_178.matrix_.
               super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<true,_(Column_types)7,_true,_true,_false,_true,_true>_>_>_>
               .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish = (uint)uVar9;
              local_178.matrix_.
              super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<true,_(Column_types)7,_true,_true,_false,_true,_true>_>_>_>
              .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_178.matrix_.
                   super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<true,_(Column_types)7,_true,_true,_false,_true,_true>_>_>_>
                   .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 != 6);
        }
        uVar1 = local_178.matrix_.
                super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<true,_(Column_types)7,_true,_true,_false,_true,_true>_>_>_>
                .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_start[1];
        uVar2 = local_178.matrix_.
                super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<true,_(Column_types)7,_true,_true,_false,_true,_true>_>_>_>
                .rowToIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_start
                [local_178.matrix_.
                 super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<true,_(Column_types)7,_true,_true,_false,_true,_true>_>_>_>
                 .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start[5]];
        local_178.matrix_.
        super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<true,_(Column_types)7,_true,_true,_false,_true,_true>_>_>_>
        .rowToIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start
        [local_178.matrix_.
         super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<true,_(Column_types)7,_true,_true,_false,_true,_true>_>_>_>
         .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start[5]] =
             local_178.matrix_.
             super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<true,_(Column_types)7,_true,_true,_false,_true,_true>_>_>_>
             .rowToIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar1];
        local_178.matrix_.
        super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<true,_(Column_types)7,_true,_true,_false,_true,_true>_>_>_>
        .rowToIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar1] = uVar2;
        uVar1 = local_178.matrix_.
                super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<true,_(Column_types)7,_true,_true,_false,_true,_true>_>_>_>
                .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_start[5];
        local_178.matrix_.
        super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<true,_(Column_types)7,_true,_true,_false,_true,_true>_>_>_>
        .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[5] =
             local_178.matrix_.
             super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<true,_(Column_types)7,_true,_true,_false,_true,_true>_>_>_>
             .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[1];
        local_178.matrix_.
        super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<true,_(Column_types)7,_true,_true,_false,_true,_true>_>_>_>
        .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[1] = uVar1;
        local_19c[0] = 2;
        local_19c[1] = 5;
        std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                   (local_190.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 4),local_19c);
        local_19c[0] = 1;
        local_19c[1] = 3;
        local_19c[2] = 4;
        std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                   (local_190.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 6),local_19c);
        local_19c[0] = 0;
        local_19c[1] = 5;
        std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                   (local_190.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1),local_19c);
        test_content_equality<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,true>>>
                  (&local_190,&local_178);
        pCVar7 = local_178.colSettings_;
        std::
        vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true>_>_>_>_>
        ::_M_erase_at_end(&local_178.matrix_.matrix_,
                          local_178.matrix_.matrix_.
                          super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        pCVar8 = local_178.colSettings_;
        local_178.matrix_.nextInsertIndex_ = 0;
        local_178.matrix_.colSettings_ = pCVar7;
        if ((pool<boost::default_user_allocator_malloc_free> *)local_178.colSettings_ !=
            (pool<boost::default_user_allocator_malloc_free> *)0x0) {
          boost::pool<boost::default_user_allocator_malloc_free>::purge_memory
                    ((pool<boost::default_user_allocator_malloc_free> *)local_178.colSettings_);
          operator_delete(pCVar8,0x38);
        }
        Gudhi::persistence_matrix::
        Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true>_>_>
        ::~Boundary_matrix(&local_178.matrix_);
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::~vector(&local_190);
        return;
      }
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar10);
}

Assistant:

void test_base_swaps() {
  auto columns = build_simple_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  test_content_equality(columns, m);

  m.swap_columns(3, 5);
  if constexpr (Matrix::Option_list::column_indexation_type == Column_indexation_types::IDENTIFIER) {
    m.swap_columns(3, 1);
  } else {
    m.swap_columns(5, 1);
    columns[3].swap(columns[5]);
    columns[5].swap(columns[1]);
  }

  test_content_equality(columns, m);

  m.swap_rows(3, 5);
  m.swap_rows(5, 1);

  if constexpr (Matrix::Option_list::is_z2) {
    columns[4] = {2, 5};
    columns[6] = {1, 3, 4};
    if constexpr (Matrix::Option_list::column_indexation_type == Column_indexation_types::IDENTIFIER) {
      columns[3] = {0, 5};
      columns[5] = {0, 2};
    } else {
      columns[1] = {0, 5};
    }
  } else {
    columns[4] = {{2, 4}, {5, 1}};
    columns[6] = {{1, 1}, {3, 4}, {4, 1}};
    if constexpr (Matrix::Option_list::column_indexation_type == Column_indexation_types::IDENTIFIER) {
      columns[3] = {{0, 1}, {5, 4}};
      columns[5] = {{0, 1}, {2, 4}};
    } else {
      columns[1] = {{0, 1}, {5, 4}};
    }
  }

  test_content_equality(columns, m);
}